

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DICEPSPlanner.cpp
# Opt level: O2

void DICEPSPlanner::SampleIndividualPolicy
               (PolicyPureVector *pol,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *ohistActionProbs)

{
  pointer pvVar1;
  int iVar2;
  double *pdVar3;
  reference pvVar4;
  uint uVar5;
  value_type vVar6;
  vector<double,_std::allocator<double>_> *action_probs;
  pointer pvVar7;
  double dVar8;
  
  pvVar1 = (ohistActionProbs->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = 0;
  for (pvVar7 = (ohistActionProbs->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pvVar7 != pvVar1; pvVar7 = pvVar7 + 1) {
    iVar2 = rand();
    dVar8 = 0.0;
    vVar6 = 0;
    for (pdVar3 = (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        (pdVar3 != (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish &&
        (dVar8 = dVar8 + *pdVar3, dVar8 < (double)iVar2 / 2147483647.0)); pdVar3 = pdVar3 + 1) {
      vVar6 = vVar6 + 1;
    }
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       (&pol->_m_domainToActionIndices,(ulong)uVar5);
    *pvVar4 = vVar6;
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

void DICEPSPlanner::SampleIndividualPolicy(PolicyPureVector& pol, 
    const vector< vector<double> >&  ohistActionProbs )
{
    vector< vector<double> >::const_iterator it = ohistActionProbs.begin();
    vector< vector<double> >::const_iterator last = ohistActionProbs.end();
    Index ohistI = 0;
    while(it != last)
    {
        //the action probabilities for the type pointed to by *it
        const vector<double> & action_probs = *it;
        double r = ((double)rand()) / RAND_MAX;
        double cumulativeActionProb = 0.0;

        Index aI = 0; //the action index
        vector<double>::const_iterator a_it = action_probs.begin();
        vector<double>::const_iterator a_last = action_probs.end();
        while(a_it != a_last)
        {
            double prob_aI = *a_it;
            cumulativeActionProb += prob_aI;
            if(cumulativeActionProb >= r) //action aI is sampled
                break;
            aI++;
            a_it++;
        }
        pol.SetAction(ohistI, aI);

        ohistI++;
        it++;
    }

}